

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::createMaterial_metal(SemanticParser *this,SP *in)

{
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *this_01;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  runtime_error *this_02;
  long *plVar7;
  element_type *peVar8;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Base_ptr this_03;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  float fVar12;
  undefined1 auVar13 [16];
  SP SVar14;
  size_t N;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  string name;
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  undefined1 local_118 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  SP *local_f0;
  SemanticParser *local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_a0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f0 = in;
  local_e8 = this;
  std::__shared_ptr<pbrt::MetalMaterial,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::MetalMaterial>,std::__cxx11::string&>
            ((__shared_ptr<pbrt::MetalMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_128,
             (allocator<pbrt::MetalMaterial> *)&local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*in_RDX + 0x60));
  p_Var10 = *(_Rb_tree_node_base **)(*in_RDX + 0x18);
  p_Var11 = (_Rb_tree_node_base *)(*in_RDX + 8);
  _Var9._M_pi = extraout_RDX;
  if (p_Var10 != p_Var11) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_a0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var10 + 1));
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_a0.first._M_dataplus._M_p,
                 local_a0.first._M_dataplus._M_p +
                 (long)(_Rb_tree_color *)local_a0.first._M_string_length);
      iVar5 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar5 == 0) {
        bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&local_70);
        if (bVar4) {
          syntactic::ParamSet::getParamTexture((ParamSet *)local_b0,(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)local_118,(SP *)local_f0);
          uVar3 = local_118._8_8_;
          uVar2 = local_118._0_8_;
          local_118._0_8_ = (element_type *)0x0;
          local_118._8_8_ = (element_type *)0x0;
          p_Var1 = (local_128->sampler).
                   super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          (local_128->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)uVar2;
          (local_128->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
          this_03 = (_Base_ptr)local_b0._8_8_;
          if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
             this_03 = (_Base_ptr)local_b0._8_8_,
             (element_type *)local_118._8_8_ != (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
            this_03 = (_Base_ptr)local_b0._8_8_;
          }
LAB_00143ce5:
          if (this_03 != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
          }
        }
        else {
          fVar12 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&local_70,0.0);
          *(float *)&(local_128->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi = fVar12;
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_70);
        if (iVar5 == 0) {
          bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&local_70);
          if (bVar4) {
            syntactic::ParamSet::getParamTexture((ParamSet *)local_c0,(string *)*in_RDX);
            findOrCreateTexture((SemanticParser *)local_118,(SP *)local_f0);
            uVar3 = local_118._8_8_;
            uVar2 = local_118._0_8_;
            local_118._0_8_ = (element_type *)0x0;
            local_118._8_8_ = (element_type *)0x0;
            this_00 = (local_128->pixelFilter).
                      super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            (local_128->integrator).super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
            (local_128->pixelFilter).
            super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)uVar3;
            this_03 = (_Base_ptr)local_c0._8_8_;
            if ((this_00 != (element_type *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
               this_03 = (_Base_ptr)local_c0._8_8_,
               (element_type *)local_118._8_8_ != (element_type *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
              this_03 = (_Base_ptr)local_c0._8_8_;
            }
            goto LAB_00143ce5;
          }
          fVar12 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&local_70,0.0);
          *(float *)&(local_128->integrator).
                     super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               fVar12;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_70);
          if (iVar5 == 0) {
            bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&local_70);
            if (bVar4) {
              syntactic::ParamSet::getParamTexture((ParamSet *)local_d0,(string *)*in_RDX);
              findOrCreateTexture((SemanticParser *)local_118,(SP *)local_f0);
              uVar3 = local_118._8_8_;
              uVar2 = local_118._0_8_;
              local_118._0_8_ = (element_type *)0x0;
              local_118._8_8_ = (element_type *)0x0;
              p_Var1 = (local_128->world).
                       super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
              (local_128->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)uVar2;
              (local_128->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
              this_03 = (_Base_ptr)local_d0._8_8_;
              if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
                 this_03 = (_Base_ptr)local_d0._8_8_,
                 (element_type *)local_118._8_8_ != (element_type *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
                this_03 = (_Base_ptr)local_d0._8_8_;
              }
              goto LAB_00143ce5;
            }
            fVar12 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&local_70,0.0);
            *(float *)&(local_128->pixelFilter).
                       super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi = fVar12;
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&local_70);
            if (iVar5 == 0) {
              bVar4 = syntactic::ParamSet::getParamBool((ParamSet *)*in_RDX,&local_70,false);
              *(bool *)&local_128[1].super_Entity._vptr_Entity = bVar4;
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)&local_70);
              if (iVar5 == 0) {
                bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)*in_RDX,&local_70);
                if (bVar4) {
                  lVar6 = 0x84;
LAB_00143c22:
                  syntactic::ParamSet::getParam3f
                            ((ParamSet *)*in_RDX,
                             (float *)((long)&(local_128->super_Entity)._vptr_Entity + lVar6),
                             &local_70);
                }
                else {
                  local_118._0_8_ = (element_type *)0x0;
                  syntactic::ParamSet::getParamPairNf
                            ((ParamSet *)*in_RDX,(value_type *)0x0,(size_t *)local_118,&local_70);
                  std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
                  resize((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                          *)((long)&local_128[1].cameras.
                                    super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                                    ._M_impl.super__Vector_impl_data + 0x10),local_118._0_8_);
                  syntactic::ParamSet::getParamPairNf
                            ((ParamSet *)*in_RDX,
                             *(value_type **)
                              ((long)&local_128[1].cameras.
                                      super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                                      ._M_impl.super__Vector_impl_data + 0x10),(size_t *)local_118,
                             &local_70);
                }
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)&local_70);
                if (iVar5 == 0) {
                  bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)*in_RDX,&local_70);
                  if (bVar4) {
                    lVar6 = 0xc0;
                    goto LAB_00143c22;
                  }
                  local_118._0_8_ = (element_type *)0x0;
                  syntactic::ParamSet::getParamPairNf
                            ((ParamSet *)*in_RDX,(value_type *)0x0,(size_t *)local_118,&local_70);
                  std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
                  resize((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                          *)&local_128[1].pixelFilter.
                             super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,local_118._0_8_);
                  syntactic::ParamSet::getParamPairNf
                            ((ParamSet *)*in_RDX,
                             (value_type *)
                             local_128[1].pixelFilter.
                             super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi,(size_t *)local_118,&local_70);
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)&local_70);
                  if (iVar5 == 0) {
                    syntactic::ParamSet::getParamTexture((ParamSet *)local_e0,(string *)*in_RDX);
                    findOrCreateTexture((SemanticParser *)local_118,(SP *)local_f0);
                    uVar3 = local_118._8_8_;
                    uVar2 = local_118._0_8_;
                    local_118._0_8_ = (element_type *)0x0;
                    local_118._8_8_ = (element_type *)0x0;
                    this_01 = local_128[2].super_Entity.super_enable_shared_from_this<pbrt::Entity>.
                              _M_weak_this.
                              super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    local_128[2].super_Entity._vptr_Entity = (_func_int **)uVar2;
                    local_128[2].super_Entity.super_enable_shared_from_this<pbrt::Entity>.
                    _M_weak_this.super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)uVar3;
                    this_03 = (_Base_ptr)local_e0._8_8_;
                    if ((this_01 != (element_type *)0x0) &&
                       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01),
                       this_03 = (_Base_ptr)local_e0._8_8_,
                       (element_type *)local_118._8_8_ != (element_type *)0x0)) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
                      this_03 = (_Base_ptr)local_e0._8_8_;
                    }
                    goto LAB_00143ce5;
                  }
                  iVar5 = std::__cxx11::string::compare((char *)&local_70);
                  if (iVar5 != 0) {
                    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::operator+(&local_50,"un-handled metal-material parameter \'",
                                   &local_a0.first);
                    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
                    local_118._0_8_ = *plVar7;
                    peVar8 = (element_type *)(plVar7 + 2);
                    if ((element_type *)local_118._0_8_ == peVar8) {
                      local_118._16_8_ = (peVar8->super_Entity)._vptr_Entity;
                      _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[3];
                      local_118._0_8_ = (element_type *)(local_118 + 0x10);
                    }
                    else {
                      local_118._16_8_ = (peVar8->super_Entity)._vptr_Entity;
                    }
                    local_118._8_8_ = plVar7[1];
                    *plVar7 = (long)peVar8;
                    plVar7[1] = 0;
                    *(undefined1 *)(plVar7 + 2) = 0;
                    std::runtime_error::runtime_error(this_02,(string *)local_118);
                    __cxa_throw(this_02,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_a0.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
        operator_delete(local_a0.first._M_dataplus._M_p);
      }
      auVar13 = std::_Rb_tree_increment(p_Var10);
      _Var9._M_pi = auVar13._8_8_;
      p_Var10 = auVar13._0_8_;
    } while (p_Var10 != p_Var11);
  }
  (local_e8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_128;
  (local_e8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_120;
  SVar14.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  SVar14.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_e8;
  return (SP)SVar14.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_metal(pbrt::syntactic::Material::SP in)
  {
    MetalMaterial::SP mat = std::make_shared<MetalMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "roughness") {
        if (in->hasParamTexture(name))
          mat->map_roughness = findOrCreateTexture(in->getParamTexture(name));
        else
          mat->roughness = in->getParam1f(name);
      }
      else if (name == "uroughness") {
        if (in->hasParamTexture(name))
          mat->map_uRoughness = findOrCreateTexture(in->getParamTexture(name));
        else
          mat->uRoughness = in->getParam1f(name);
      }
      else if (name == "vroughness") {
        if (in->hasParamTexture(name))
          mat->map_vRoughness = findOrCreateTexture(in->getParamTexture(name));
        else
          mat->vRoughness = in->getParam1f(name);
      }
      else if (name == "remaproughness") {
        mat->remapRoughness = in->getParamBool(name);
      }
      else if (name == "eta") {
        if (in->hasParam3f(name))
          in->getParam3f(&mat->eta.x,name);
        else {
          std::size_t N=0;
          in->getParamPairNf(nullptr,&N,name);
          mat->spectrum_eta.spd.resize(N);
          in->getParamPairNf(mat->spectrum_eta.spd.data(),&N,name);
        }
      }
      else if (name == "k") {
        if (in->hasParam3f(name))
          in->getParam3f(&mat->k.x,name);
        else {
          std::size_t N=0;
          in->getParamPairNf(nullptr,&N,name);
          mat->spectrum_k.spd.resize(N);
          in->getParamPairNf(mat->spectrum_k.spd.data(),&N,name);
        }
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled metal-material parameter '"+it.first+"'");
    };
    return mat;
  }